

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString>::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QLatin1String,_QString>,_QString> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  QChar *pQVar4;
  char16_t *pcVar5;
  
  if ((((this->a).a.m_data == (char *)0x0) && ((this->a).b.d.ptr == (char16_t *)0x0)) &&
     ((this->b).d.ptr == (char16_t *)0x0)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar1 = (this->a).b.d.size;
    lVar2 = (this->a).a.m_size;
    lVar3 = (this->b).d.size;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::QString(__return_storage_ptr__,lVar1 + lVar2 + lVar3,Uninitialized);
    pQVar4 = (QChar *)(__return_storage_ptr__->d).ptr;
    lVar1 = (this->a).a.m_size;
    QAbstractConcatenable::appendLatin1To((this->a).a,pQVar4);
    pQVar4 = pQVar4 + lVar1;
    lVar1 = (this->a).b.d.size;
    if (lVar1 != 0) {
      pcVar5 = (this->a).b.d.ptr;
      if (pcVar5 == (char16_t *)0x0) {
        pcVar5 = (char16_t *)&QString::_empty;
      }
      memcpy(pQVar4,pcVar5,lVar1 * 2);
    }
    lVar2 = (this->b).d.size;
    if (lVar2 != 0) {
      pcVar5 = (this->b).d.ptr;
      if (pcVar5 == (char16_t *)0x0) {
        pcVar5 = (char16_t *)&QString::_empty;
      }
      memcpy(pQVar4 + lVar1,pcVar5,lVar2 * 2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }